

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O1

void __thiscall pm::World::World(World *this)

{
  Light *pLVar1;
  
  (this->viewplane_).width_ = 0x780;
  (this->viewplane_).height_ = 0x438;
  (this->viewplane_).pixelSize_ = 1.0;
  (this->viewplane_).gamma_ = 1.0;
  (this->viewplane_).invGamma_ = 1.0;
  (this->viewplane_).maxDepth_ = 1;
  SamplerState::SamplerState(&(this->viewplane_).samplerState_);
  (this->background_).r = 0.0;
  (this->background_).g = 0.0;
  (this->background_).b = 0.0;
  (this->objects_).
  super__Vector_base<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objects_).
  super__Vector_base<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objects_).
  super__Vector_base<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->materials_).
  super__Vector_base<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->materials_).
  super__Vector_base<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->materials_).
  super__Vector_base<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar1 = (Light *)operator_new(0x20);
  pLVar1->type_ = AMBIENT;
  pLVar1->castShadows_ = true;
  pLVar1->_vptr_Light = (_func_int **)&PTR__Light_00116928;
  pLVar1[1]._vptr_Light = (_func_int **)0x3f80000000000000;
  pLVar1[1].type_ = 0x3f800000;
  pLVar1[1].castShadows_ = false;
  *(undefined3 *)&pLVar1[1].field_0xd = 0x3f8000;
  (this->ambientLight_)._M_t.super___uniq_ptr_impl<pm::Light,_std::default_delete<pm::Light>_>._M_t.
  super__Tuple_impl<0UL,_pm::Light_*,_std::default_delete<pm::Light>_>.
  super__Head_base<0UL,_pm::Light_*,_false>._M_head_impl = pLVar1;
  (this->lights_).
  super__Vector_base<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>,_std::allocator<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lights_).
  super__Vector_base<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>,_std::allocator<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lights_).
  super__Vector_base<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>,_std::allocator<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->samplers_).
  super__Vector_base<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->samplers_).
  super__Vector_base<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->samplers_).
  super__Vector_base<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

World::World()
    : background_(0.0f, 0.0f, 0.0f),
      ambientLight_(std::make_unique<Ambient>(0.0f))
{
}